

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_20::ComputeKRMmatricesGlobal
          (ChElementHexaCorot_20 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  ChMatrix33<double> *R;
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  Scalar *pSVar6;
  int id;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double mkfactor;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_f0;
  ChMatrixDynamic<> CKCt;
  ChMatrixDynamic<> CK;
  ChMatrixRef local_80;
  ChMatrixRef local_58;
  
  lVar7 = (H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value;
  iVar5 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])();
  if (lVar7 == iVar5) {
    lVar7 = (H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value;
    iVar5 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
    if (lVar7 == iVar5) {
      local_f0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data._0_4_ = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
      CKCt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data._0_4_ =
           (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&CK,(int *)&local_f0,(int *)&CKCt);
      local_f0.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data._0_4_ = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
      iVar5 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
      mkfactor = (double)CONCAT44(mkfactor._4_4_,iVar5);
      Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                ((Matrix<double,_1,_1,1,_1,_1> *)&CKCt,(int *)&local_f0,(int *)&mkfactor);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_f0
                 ,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&this->StiffnessMatrix,
                 (type *)0x0);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_58,
                 &CK.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(type *)0x0);
      R = &(this->super_ChElementCorotational).A;
      ChMatrixCorotation::ComputeCK(&local_f0,R,0x14,&local_58);
      Eigen::internal::handmade_aligned_free
                (local_f0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_f0
                 ,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&CK,(type *)0x0);
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_80,
                 &CKCt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(type *)0x0)
      ;
      ChMatrixCorotation::ComputeKCt(&local_f0,R,0x14,&local_80);
      Eigen::internal::handmade_aligned_free
                (local_f0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data);
      std::__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_f0,
                 &(this->Material).
                  super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = Rfactor;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = Kfactor;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(CONCAT44(local_f0.
                                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                         .
                                         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                         .m_data._4_4_,
                                         (int)local_f0.
                                              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                              .
                                              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                              .m_data) + 0x50);
      auVar2 = vfmadd231sd_fma(auVar11,auVar8,auVar2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_f0.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows);
      mkfactor = auVar2._0_8_;
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                        *)&local_f0,&mkfactor,(StorageBaseType *)&CKCt);
      Eigen::internal::
      call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
                (H,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                    *)&local_f0);
      if ((Mfactor != 0.0) || (NAN(Mfactor))) {
        lVar7 = 0;
        auVar10._0_8_ =
             (this->Volume *
             (((this->Material).
               super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ChContinuumMaterial).density) / 20.0;
        while( true ) {
          iVar5 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
          if (iVar5 <= lVar7) break;
          std::__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr((__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> *)
                       &local_f0,
                       &(this->Material).
                        super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                      );
          uVar1 = *(ulong *)(CONCAT44(local_f0.
                                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                      .
                                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                      .m_data._4_4_,
                                      (int)local_f0.
                                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                           .
                                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                           .m_data) + 0x48);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_f0.
                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      .
                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_rows);
          pSVar6 = Eigen::
                   DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                 *)H,lVar7,lVar7);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = Rfactor;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar1;
          lVar7 = lVar7 + 1;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = Mfactor;
          auVar2 = vfmadd213sd_fma(auVar12,auVar9,auVar3);
          auVar10._8_8_ = 0;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *pSVar6;
          auVar2 = vfmadd213sd_fma(auVar2,auVar10,auVar4);
          *pSVar6 = auVar2._0_8_;
        }
      }
      Eigen::internal::handmade_aligned_free
                ((void *)CONCAT44(CKCt.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                  m_storage.m_data._4_4_,
                                  (int)CKCt.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                       .m_storage.m_data));
      Eigen::internal::handmade_aligned_free
                (CK.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                 m_data);
      return;
    }
  }
  __assert_fail("(H.rows() == GetNdofs()) && (H.cols() == GetNdofs())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaCorot_20.cpp"
                ,0x22c,
                "virtual void chrono::fea::ChElementHexaCorot_20::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementHexaCorot_20::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == GetNdofs()) && (H.cols() == GetNdofs()));

    // warp the local stiffness matrix K in order to obtain global
    // tangent stiffness CKCt:
    ChMatrixDynamic<> CK(GetNdofs(), GetNdofs());
    ChMatrixDynamic<> CKCt(GetNdofs(), GetNdofs());  // the global, corotated, K matrix, for 20 nodes
    ChMatrixCorotation::ComputeCK(StiffnessMatrix, this->A, 20, CK);
    ChMatrixCorotation::ComputeKCt(CK, this->A, 20, CKCt);

    // For K stiffness matrix and R damping matrix:

    double mkfactor = Kfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingK();
    H = mkfactor * CKCt;

    // For M mass matrix:
    if (Mfactor) {
        double lumped_node_mass = (this->Volume * this->Material->Get_density()) / 20.0;
        for (int id = 0; id < GetNdofs(); id++) {
            double amfactor = Mfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingM();
            H(id, id) += amfactor * lumped_node_mass;
        }
    }
    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.
}